

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg.c
# Opt level: O1

void tcg_temp_free_internal_riscv32(TCGContext_conflict9 *s,TCGTemp *ts)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar2 = *(ulong *)ts;
  *(ulong *)ts = uVar2 & 0xffffff5fffffffff;
  uVar3 = ((long)ts + (-0x388 - (long)s) >> 3) * 0x6db6db6db6db6db7;
  puVar1 = (ulong *)((long)s->free_temps[0].l +
                    (uVar3 >> 6) * 8 +
                    (ulong)((((uint)(uVar2 >> 0x26) & 1) * 5 + ((uint)(uVar2 >> 0x10) & 0xff)) *
                           0x40));
  *puVar1 = *puVar1 | 1L << ((byte)uVar3 & 0x3f);
  return;
}

Assistant:

void tcg_temp_free_internal(TCGContext *s, TCGTemp *ts)
{
    int k, idx;

#if defined(CONFIG_DEBUG_TCG)
    s->temps_in_use--;
    if (s->temps_in_use < 0) {
        fprintf(stderr, "More temporaries freed than allocated!\n");
    }
#endif

    tcg_debug_assert(ts->temp_global == 0);
    tcg_debug_assert(ts->temp_allocated != 0);
    ts->temp_allocated = 0;

    idx = temp_idx(s, ts);
    k = ts->base_type + (ts->temp_local ? TCG_TYPE_COUNT : 0);
    set_bit(idx, s->free_temps[k].l);
}